

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

QChar * __thiscall
QUtf16::convertToUnicode
          (QUtf16 *this,QChar *out,QByteArrayView in,State *state,DataEndianness endian)

{
  QUtf16 *pQVar1;
  uint uVar2;
  byte bVar3;
  QChar QVar4;
  ushort uVar5;
  uint *puVar6;
  QUtf16 *source;
  QUtf16 QVar7;
  uint uVar8;
  long lVar9;
  
  uVar8 = (uint)state;
  puVar6 = (uint *)in.m_data;
  source = (QUtf16 *)in.m_size;
  if (uVar8 == 0) {
    uVar8 = puVar6[6];
  }
  lVar9 = *(long *)(puVar6 + 2);
  if ((long)&out->ucs + lVar9 < 2) {
    if (out == (QChar *)0x0) {
      return (QChar *)this;
    }
    puVar6[2] = 1;
    puVar6[3] = 0;
    QVar7 = *source;
    goto LAB_00338f84;
  }
  pQVar1 = source + (long)out;
  uVar2 = puVar6[1];
  bVar3 = ((byte)*puVar6 & 8) >> 3;
  if (bVar3 == 0 && (uVar2 & 1) == 0) {
    if (lVar9 != 0) goto LAB_00338eb9;
    QVar7 = *source;
    source = source + 1;
LAB_00338ec5:
    puVar6[1] = uVar2 | 1;
    uVar5 = CONCAT11(*source,QVar7);
    if ((uVar8 == 1) || ((uVar8 == 0 && (uVar8 = 2, uVar5 == 0xfffe)))) {
      uVar5 = uVar5 << 8 | (ushort)(byte)*source;
      uVar8 = 1;
    }
    source = source + 1;
    if ((bVar3 != 0 || (uVar2 & 1) != 0) || uVar5 != 0xfeff) {
      *(ushort *)this = uVar5;
      this = this + 2;
    }
LAB_00338f13:
    out = (QChar *)(pQVar1 + -(long)source);
    lVar9 = (long)out >> 1;
    if (uVar8 != 1) goto LAB_00338f39;
    qbswap<2>(source,lVar9,this);
    uVar8 = 1;
  }
  else {
    if (lVar9 != 0) {
LAB_00338eb9:
      QVar7 = *(QUtf16 *)(puVar6 + 7);
      goto LAB_00338ec5;
    }
    if (uVar8 != 0) goto LAB_00338f13;
    lVar9 = (long)out >> 1;
    uVar8 = 2;
LAB_00338f39:
    if (source != this) {
      memcpy(this,source,lVar9 * 2);
    }
  }
  this = this + lVar9 * 2;
  puVar6[6] = uVar8;
  puVar6[2] = 0;
  puVar6[3] = 0;
  if (((ulong)out & 1) == 0) {
    puVar6[7] = 0;
    return (QChar *)this;
  }
  if ((*puVar6 & 1) != 0) {
    QVar4.ucs = L'�';
    if ((*puVar6 & 2) != 0) {
      QVar4.ucs = L'\0';
    }
    *(char16_t *)this = QVar4.ucs;
    return (QChar *)(this + 2);
  }
  puVar6[2] = 1;
  puVar6[3] = 0;
  QVar7 = pQVar1[-1];
LAB_00338f84:
  puVar6[7] = (int)(char)QVar7;
  return (QChar *)this;
}

Assistant:

QChar *QUtf16::convertToUnicode(QChar *out, QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    qsizetype len = in.size();
    const char *chars = in.data();

    Q_ASSERT(state);

    if (endian == DetectEndianness)
        endian = (DataEndianness)state->state_data[Endian];

    const char *end = chars + len;

    // make sure we can decode at least one char
    if (state->remainingChars + len < 2) {
        if (len) {
            Q_ASSERT(state->remainingChars == 0 && len == 1);
            state->remainingChars = 1;
            state->state_data[Data] = *chars;
        }
        return out;
    }

    bool headerdone = state && state->internalState & HeaderDone;
    if (state->flags & QStringConverter::Flag::ConvertInitialBom)
        headerdone = true;

    if (!headerdone || state->remainingChars) {
        uchar buf;
        if (state->remainingChars)
            buf = state->state_data[Data];
        else
            buf = *chars++;

        // detect BOM, set endianness
        state->internalState |= HeaderDone;
        QChar ch(buf, *chars++);
        if (endian == DetectEndianness) {
            // someone set us up the BOM
            if (ch == QChar::ByteOrderSwapped) {
                endian = BigEndianness;
            } else if (ch == QChar::ByteOrderMark) {
                endian = LittleEndianness;
            } else {
                if (QSysInfo::ByteOrder == QSysInfo::BigEndian) {
                    endian = BigEndianness;
                } else {
                    endian = LittleEndianness;
                }
            }
        }
        if (endian == BigEndianness)
            ch = QChar::fromUcs2((ch.unicode() >> 8) | ((ch.unicode() & 0xff) << 8));
        if (headerdone || ch != QChar::ByteOrderMark)
            *out++ = ch;
    } else if (endian == DetectEndianness) {
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;
    }

    qsizetype nPairs = (end - chars) >> 1;
    if (endian == BigEndianness)
        qFromBigEndian<char16_t>(chars, nPairs, out);
    else
        qFromLittleEndian<char16_t>(chars, nPairs, out);
    out += nPairs;

    state->state_data[Endian] = endian;
    state->remainingChars = 0;
    if ((end - chars) & 1) {
        if (state->flags & QStringConverter::Flag::Stateless) {
            *out++ = state->flags & QStringConverter::Flag::ConvertInvalidToNull ? QChar::Null : QChar::ReplacementCharacter;
        } else {
            state->remainingChars = 1;
            state->state_data[Data] = *(end - 1);
        }
    } else {
        state->state_data[Data] = 0;
    }

    return out;
}